

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapBit
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  long *plVar7;
  
  if ((this->schema_).has_bits_offset_ != -1) {
    bVar5 = HasBit(this,message1,field);
    bVar6 = HasBit(this,message2,field);
    uVar2 = (this->schema_).has_bits_offset_;
    if (bVar6) {
      if (uVar2 != 0xffffffff) {
        if (field[0x42] == (FieldDescriptor)0x0) {
          plVar7 = (long *)(*(long *)(field + 0x50) + 0x28);
        }
        else if (*(long *)(field + 0x60) == 0) {
          plVar7 = (long *)(*(long *)(field + 0x28) + 0x80);
        }
        else {
          plVar7 = (long *)(*(long *)(field + 0x60) + 0x50);
        }
        uVar3 = (this->schema_).has_bit_indices_
                [(int)((ulong)((long)field - *plVar7) >> 3) * 0x286bca1b];
        puVar1 = (uint *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar3 >> 5) * 4 + (ulong)uVar2);
        *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      }
    }
    else if (uVar2 != 0xffffffff) {
      if (field[0x42] == (FieldDescriptor)0x0) {
        plVar7 = (long *)(*(long *)(field + 0x50) + 0x28);
      }
      else if (*(long *)(field + 0x60) == 0) {
        plVar7 = (long *)(*(long *)(field + 0x28) + 0x80);
      }
      else {
        plVar7 = (long *)(*(long *)(field + 0x60) + 0x50);
      }
      uVar3 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field - *plVar7) >> 3) * 0x286bca1b];
      bVar4 = (byte)uVar3 & 0x1f;
      puVar1 = (uint *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar3 >> 5) * 4 + (ulong)uVar2);
      *puVar1 = *puVar1 & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
    }
    uVar2 = (this->schema_).has_bits_offset_;
    if (bVar5) {
      if (uVar2 != 0xffffffff) {
        if (field[0x42] == (FieldDescriptor)0x0) {
          plVar7 = (long *)(*(long *)(field + 0x50) + 0x28);
        }
        else if (*(long *)(field + 0x60) == 0) {
          plVar7 = (long *)(*(long *)(field + 0x28) + 0x80);
        }
        else {
          plVar7 = (long *)(*(long *)(field + 0x60) + 0x50);
        }
        uVar3 = (this->schema_).has_bit_indices_
                [(int)((ulong)((long)field - *plVar7) >> 3) * 0x286bca1b];
        puVar1 = (uint *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar3 >> 5) * 4 + (ulong)uVar2);
        *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      }
    }
    else if (uVar2 != 0xffffffff) {
      if (field[0x42] == (FieldDescriptor)0x0) {
        plVar7 = (long *)(*(long *)(field + 0x50) + 0x28);
      }
      else if (*(long *)(field + 0x60) == 0) {
        plVar7 = (long *)(*(long *)(field + 0x28) + 0x80);
      }
      else {
        plVar7 = (long *)(*(long *)(field + 0x60) + 0x50);
      }
      uVar3 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field - *plVar7) >> 3) * 0x286bca1b];
      bVar4 = (byte)uVar3 & 0x1f;
      puVar1 = (uint *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar3 >> 5) * 4 + (ulong)uVar2);
      *puVar1 = *puVar1 & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
    }
  }
  return;
}

Assistant:

uint32 HasBitIndex(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(HasHasbits());
    return has_bit_indices_[field->index()];
  }